

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O0

void __thiscall
efsw::DirectorySnapshot::DirectorySnapshot(DirectorySnapshot *this,string *directory)

{
  string local_38 [32];
  string *local_18;
  string *directory_local;
  DirectorySnapshot *this_local;
  
  local_18 = directory;
  directory_local = (string *)this;
  FileInfo::FileInfo(&this->DirectoryInfo);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  ::map(&this->Files);
  std::__cxx11::string::string(local_38,(string *)directory);
  init(this,(EVP_PKEY_CTX *)local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

DirectorySnapshot::DirectorySnapshot( std::string directory ) {
	init( directory );
}